

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_traits_macro_functional_tests.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4574528::ns::Person_ACGN::Person_ACGN
          (Person_ACGN *this,string *name,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *socialSecurityNumber)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  std::
  _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ::_Optional_base(&(this->socialSecurityNumber_).
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ,&socialSecurityNumber->
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  );
  return;
}

Assistant:

Person_ACGN(const std::string& name, const jsoncons::optional<std::string>& socialSecurityNumber)
            : name_(name), socialSecurityNumber_(socialSecurityNumber)
          {
          }